

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

mdns_string_t mdns_string_extract(void *buffer,size_t size,size_t *offset,char *str,size_t capacity)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong __n;
  size_t sVar4;
  char *__dest;
  size_t sVar5;
  mdns_string_t mVar6;
  mdns_string_pair_t local_48;
  
  sVar5 = *offset;
  sVar3 = 0xffffffffffffffff;
  sVar4 = capacity;
  __dest = str;
  do {
    mdns_get_next_substring(&local_48,buffer,size,sVar5);
    sVar2 = local_48.length;
    sVar1 = local_48.offset;
    if (local_48.offset == 0xffffffffffffffff) {
      sVar4 = 0;
      goto LAB_00249023;
    }
    sVar5 = sVar5 + 2;
    if (sVar3 != 0xffffffffffffffff) {
      sVar5 = sVar3;
    }
    if (local_48.ref == 0) {
      sVar5 = sVar3;
    }
    sVar3 = sVar5;
    if (local_48.length != 0) {
      __n = sVar4;
      if (local_48.length < sVar4) {
        __n = local_48.length;
      }
      memcpy(__dest,(void *)((long)buffer + local_48.offset),__n);
      __dest = __dest + __n;
      if (sVar2 < sVar4) {
        *__dest = '.';
        __dest = __dest + 1;
        sVar4 = sVar4 + ~__n;
      }
      else {
        sVar4 = 0;
      }
    }
    sVar5 = sVar1 + sVar2;
  } while (sVar2 != 0);
  sVar5 = sVar5 + 1;
  if (sVar3 != 0xffffffffffffffff) {
    sVar5 = sVar3;
  }
  *offset = sVar5;
  sVar4 = capacity - sVar4;
LAB_00249023:
  mVar6.length = sVar4;
  mVar6.str = str;
  return mVar6;
}

Assistant:

mdns_string_t
mdns_string_extract(const void* buffer, size_t size, size_t* offset,
                    char* str, size_t capacity) {
	size_t cur = *offset;
	size_t end = MDNS_INVALID_POS;
	mdns_string_pair_t substr;
	mdns_string_t result = {str, 0};
	char* dst = str;
	size_t remain = capacity;
	do {
		substr = mdns_get_next_substring(buffer, size, cur);
		if (substr.offset == MDNS_INVALID_POS)
			return result;
		if (substr.ref && (end == MDNS_INVALID_POS))
			end = cur + 2;
		if (substr.length) {
			size_t to_copy = (substr.length < remain) ? substr.length : remain;
			memcpy(dst, (const char*)buffer + substr.offset, to_copy);
			dst += to_copy;
			remain -= to_copy;
			if (remain) {
				*dst++ = '.';
				--remain;
			}
		}
		cur = substr.offset + substr.length;
	}
	while (substr.length);

	if (end == MDNS_INVALID_POS)
		end = cur + 1;
	*offset = end;

	result.length = capacity - remain;
	return result;
}